

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::WildcardPortConnectionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,WildcardPortConnectionSyntax *this,
          size_t index)

{
  Token token;
  SyntaxNode *local_50;
  size_t index_local;
  WildcardPortConnectionSyntax *this_local;
  
  if (index == 0) {
    local_50 = (SyntaxNode *)0x0;
    if (this != (WildcardPortConnectionSyntax *)0xfffffffffffffff0) {
      local_50 = &(this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.
                  super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_50);
  }
  else if (index == 1) {
    token.kind = (this->dotStar).kind;
    token._2_1_ = (this->dotStar).field_0x2;
    token.numFlags.raw = (this->dotStar).numFlags.raw;
    token.rawLen = (this->dotStar).rawLen;
    token.info = (this->dotStar).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax WildcardPortConnectionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return dotStar;
        default: return nullptr;
    }
}